

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::GetKeyName(ImGuiKey key)

{
  if (key == ImGuiKey_KeysData_OFFSET) {
    return "None";
  }
  if (key < ImGuiKey_NamedKey_BEGIN) {
    key = (GImGui->IO).KeyMap[key];
    if (key == ~ImGuiKey_KeysData_OFFSET) {
      return "N/A";
    }
  }
  if ((key & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
    key = ConvertSingleModFlagToKey(key);
  }
  if (key - ImGuiKey_NamedKey_BEGIN < 0x9a) {
    return _ZL9GKeyNames_rel +
           *(int *)(_ZL9GKeyNames_rel + (ulong)(key - ImGuiKey_NamedKey_BEGIN) * 4);
  }
  return "Unknown";
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
    if (key == ImGuiKey_None)
        return "None";
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT(IsNamedKeyOrMod(key) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    ImGuiContext& g = *GImGui;
    if (IsLegacyKey(key))
    {
        if (g.IO.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)g.IO.KeyMap[key]));
        key = (ImGuiKey)g.IO.KeyMap[key];
    }
#endif
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}